

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O3

void __thiscall
TPZHCurlEquationFilter<double>::ChooseVertexAndEdge
          (TPZHCurlEquationFilter<double> *this,int64_t *treatVertex,int64_t *remEdge)

{
  map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
  *this_00;
  _Rb_tree_color _Var1;
  const_iterator __position;
  bool bVar2;
  TPZHCurlEquationFilter<double> *pTVar3;
  _Base_ptr p_Var4;
  long *__k;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *this_01;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *this_02;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *p_Var10;
  const_iterator cVar11;
  map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
  *this_03;
  long lVar12;
  pair<std::_Rb_tree_iterator<long>,_std::_Rb_tree_iterator<long>_> pVar13;
  long ibase;
  int64_t base_node;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *__range1;
  int64_t ibase_free;
  long local_a0;
  _Base_ptr local_98;
  _Rb_tree_node_base *local_90;
  key_type_conflict1 local_88;
  key_type_conflict1 local_80;
  TPZHCurlEquationFilter<double> *local_78;
  _Base_ptr local_70;
  int64_t *local_68;
  long *local_60;
  map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
  *local_58;
  map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
  *local_50;
  _Rb_tree_node_base *local_48;
  _Rb_tree_node_base *local_40;
  long local_38;
  
  local_50 = &this->freeEdgesToTreatedNodes;
  local_70 = (_Base_ptr)&this->field_0xa0;
  local_98 = *(_Base_ptr *)&this->field_0xb0;
  local_78 = this;
  local_68 = remEdge;
  local_60 = treatVertex;
  if (local_98 != local_70) {
    this_03 = &this->mEdge;
    bVar2 = false;
    local_58 = this_03;
    do {
      if (bVar2) break;
      p_Var9 = *(_Rb_tree_node_base **)(local_98 + 2);
      local_48 = (_Rb_tree_node_base *)&local_98[1]._M_left;
      if (p_Var9 != local_48) {
        do {
          local_88 = *(key_type_conflict1 *)(p_Var9 + 1);
          if (bVar2) break;
          local_40 = p_Var9;
          pmVar5 = std::
                   map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                   ::operator[](&this->mVertex,&local_88);
          p_Var8 = (pmVar5->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var9 = &(pmVar5->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var7 = p_Var9;
          if (p_Var8 != p_Var9) {
            do {
              local_90 = p_Var7;
              lVar12 = (long)(int)p_Var8[1]._M_color;
              local_a0 = lVar12;
              pmVar6 = std::
                       map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                       ::operator[](this_03,&local_a0);
              if (pmVar6->status == EFreeEdge) {
                if (bVar2) break;
                local_a0 = lVar12;
                pmVar6 = std::
                         map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
                         ::operator[](this_03,&local_a0);
                p_Var7 = (pmVar6->vertex_connect)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
                while (p_Var9 = local_90,
                      (_Rb_tree_header *)p_Var7 !=
                      &(pmVar6->vertex_connect)._M_t._M_impl.super__Rb_tree_header) {
                  _Var1 = p_Var7[1]._M_color;
                  local_a0 = (long)(int)_Var1;
                  pmVar5 = std::
                           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
                           ::operator[](&this->mVertex,&local_a0);
                  if (pmVar5->status != ETreatedVertex) {
                    local_80 = local_88;
                    *local_68 = lVar12;
                    *local_60 = (long)(int)_Var1;
                    local_38 = *(long *)(local_98 + 1);
                    bVar2 = true;
                    this_03 = local_58;
                    p_Var9 = local_90;
                    break;
                  }
                  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
                  this_03 = local_58;
                }
              }
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
              p_Var7 = local_90;
            } while (p_Var8 != p_Var9);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_40);
        } while (p_Var9 != local_48);
      }
      local_98 = (_Base_ptr)std::_Rb_tree_increment(local_98);
    } while (local_98 != local_70);
  }
  pTVar3 = local_78;
  this_00 = &local_78->mVertex;
  pmVar5 = std::
           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
           ::operator[](this_00,&local_80);
  __k = local_60;
  pmVar5->free_edges = pmVar5->free_edges + -1;
  pmVar5 = std::
           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
           ::operator[](this_00,local_60);
  pmVar5->free_edges = pmVar5->free_edges + -1;
  pmVar6 = std::
           map<long,_TPZHCurlEquationFilter<double>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::EdgeFilter>_>_>
           ::operator[](&pTVar3->mEdge,local_68);
  this_01 = local_50;
  pmVar6->status = ERemovedEdge;
  this_02 = &std::
             map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
             ::operator[](local_50,&local_38)->_M_t;
  pVar13 = std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
           equal_range(this_02,&local_80);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_erase_aux(this_02,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
  local_88 = local_38 + -1;
  p_Var10 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
            std::
            map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
            ::operator[](this_01,&local_88);
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>(p_Var10,&local_80);
  pmVar5 = std::
           map<long,_TPZHCurlEquationFilter<double>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<double>::VertexFilter>_>_>
           ::operator[](this_00,__k);
  p_Var10 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
            std::
            map<long,_std::set<long,_std::less<long>,_std::allocator<long>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
            ::operator[](this_01,&pmVar5->free_edges);
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>(p_Var10,__k);
  p_Var4 = local_70;
  cVar11._M_node = *(_Base_ptr *)&pTVar3->field_0xb0;
  while (__position._M_node = cVar11._M_node, __position._M_node != p_Var4) {
    p_Var8 = __position._M_node[2]._M_left;
    cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (p_Var8 == (_Base_ptr)0x0) {
      std::
      _Rb_tree<long,_std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<long,_std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>,_std::_Select1st<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_long,_std::set<long,_std::less<long>,_std::allocator<long>_>_>_>_>
                      *)this_01,__position);
    }
  }
  return;
}

Assistant:

void TPZHCurlEquationFilter<TVar>::ChooseVertexAndEdge(int64_t &treatVertex, int64_t &remEdge)
{
    
    // The treated node must be connected to an already treated node by a free edge
    // Thus, we take a treated node and then a free edge and its 
    // corresponding second node to be the treated one
    auto highest = freeEdgesToTreatedNodes.rbegin()->first; // highest number of free edges
    int64_t base_node;
    int64_t ibase_free;
    bool flag = false;
    // We look at all the treated nodes, starting from the one with the highest number of free edges
    for (const auto& free_edges : freeEdgesToTreatedNodes){
        if (flag) break;
        // We loop over each treated vertex with the maximum value of free edges (called basis node) 
        for (auto ibase : free_edges.second){       
            if (flag) break;
            // We loop over each edge connected to the basis node
            for (auto iedge : mVertex[ibase].edge_connect){
                if (mEdge[iedge].status != EFreeEdge) continue; // only free edges can be removed
                if (flag) break;
                // For each edge connected to the basis node, check if the complementary 
                // node has been treated before (to avoid choosing the same treatedNode more than once)
                for (auto inode : mEdge[iedge].vertex_connect){
                    if (mVertex[inode].status == ETreatedVertex) {
                        //The complementary node has been tretated, go to the next one
                        continue;
                    }
                    // The node was not treated before, then it is the chosen one.
                    // Thus fill the variables with the proper values
                    base_node = ibase;
                    remEdge = iedge;
                    treatVertex = inode;
                    ibase_free = free_edges.first;
                    
                    flag = true;
                    break;
                }
            }
        }
    }

    mVertex[base_node].free_edges--;
    mVertex[treatVertex].free_edges--;
    mEdge[remEdge].status = ERemovedEdge;
    
    //Update the data structure.
    //Delete node and realocate the base node
    freeEdgesToTreatedNodes[ibase_free].erase(base_node);
    freeEdgesToTreatedNodes[ibase_free-1].insert(base_node);
    //Insert treatVertex
    freeEdgesToTreatedNodes[mVertex[treatVertex].free_edges].insert(treatVertex);

    //Clears the freeEdgesToTreatedNodes with 0 nodes in some free edges - to avoid a bug when looping std::map
    for (auto it = freeEdgesToTreatedNodes.cbegin(); it != freeEdgesToTreatedNodes.cend();) {
        if (it->second.size() == 0) {
            freeEdgesToTreatedNodes.erase(it++);
        } else {
            ++it;
        }
    }//it
}